

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O3

iterator cmOutputConverter::Shell_SkipMakeVariables(iterator c,iterator end)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
LAB_001b9f0d:
  pcVar3 = c;
  if (pcVar3 == end) {
    return pcVar3;
  }
  if (pcVar3 + 1 == end) {
    return pcVar3;
  }
  if (*pcVar3 != '$') {
    return pcVar3;
  }
  if (pcVar3[1] != '(') {
    return pcVar3;
  }
  pcVar4 = pcVar3 + 2;
  do {
    if (pcVar4 == end) {
      return pcVar3;
    }
    cVar1 = *pcVar4;
    if (cVar1 != '_') {
      if (cVar1 == '\0') {
        return pcVar3;
      }
      iVar2 = isalpha((int)cVar1);
      if (iVar2 == 0) break;
    }
    pcVar4 = pcVar4 + 1;
  } while( true );
  c = pcVar4 + 1;
  if (cVar1 != ')') {
    return pcVar3;
  }
  goto LAB_001b9f0d;
}

Assistant:

cm::string_view::iterator cmOutputConverter::Shell_SkipMakeVariables(
  cm::string_view::iterator c, cm::string_view::iterator end)
{
  while ((c != end && (c + 1) != end) && (*c == '$' && *(c + 1) == '(')) {
    cm::string_view::iterator skip = c + 2;
    while ((skip != end) && Shell_CharIsMakeVariableName(*skip)) {
      ++skip;
    }
    if ((skip != end) && *skip == ')') {
      c = skip + 1;
    } else {
      break;
    }
  }
  return c;
}